

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3cgen.cpp
# Opt level: O2

void __thiscall WasmCGen::If(WasmCGen *this)

{
  string local_30;
  
  printf("/*%s*/\n","If");
  w3SourceGenStack::pop_abi_cxx11_(&local_30,&(this->super_w3SourceGen).stack);
  printf("if (%s) {\n",local_30._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

CGEN (If)
{
    printf ("/*%s*/\n", __func__);
    printf ("if (%s) {\n", pop().c_str());
}